

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Coap::SendHeaderResponse
          (Error *__return_storage_ptr__,Coap *this,Code aCode,Request *aRequest)

{
  char cVar1;
  uint uVar2;
  char *from;
  char *to;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  string local_128;
  undefined1 local_108 [40];
  parse_func local_e0 [1];
  Response local_d8;
  undefined1 local_50 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  local_d8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.mRequestUri._M_dataplus._M_p = (pointer)&local_d8.mRequestUri.field_2;
  local_d8.mOptions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.mRequestUri._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_d8.mRequestUri.field_2._M_local_buf[0] = '\0';
  local_d8.mSubType = kNone;
  local_d8.mEndpoint = (Endpoint *)0x0;
  local_d8.mHeader._0_1_ = 1;
  local_d8.mHeader.mCode = '\0';
  local_d8.mHeader.mMessageId = 0;
  uVar2 = *(uint *)&aRequest->mHeader >> 2 & 3;
  local_d8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.mOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (uVar2 == 1) {
    local_d8.mHeader.mCode = aCode;
    local_d8.mHeader._0_1_ = 5;
    local_d8.mHeader.mMessageId = (short)*(undefined4 *)&this->mMessageId + 1;
    this->mMessageId = local_d8.mHeader.mMessageId;
  }
  else {
    if (uVar2 != 0) {
      local_108._0_4_ = none_type;
      local_108._8_8_ = "a CoAP request is neither Confirmable nor NON-Confirmable";
      local_108._16_8_ = 0x39;
      local_108._24_8_ = 0;
      local_e0[0] = (parse_func)0x0;
      from = "a CoAP request is neither Confirmable nor NON-Confirmable";
      write.handler_ = (format_string_checker<char> *)local_108;
      local_108._32_8_ = (format_string_checker<char> *)local_108;
      while (from != "") {
        cVar1 = *from;
        to = from;
        while (cVar1 != '{') {
          to = to + 1;
          if (to == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,from,"");
            goto LAB_0019fb61;
          }
          cVar1 = *to;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,from,to);
        from = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",(format_string_checker<char> *)local_108);
      }
LAB_0019fb61:
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_108;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_128,(v10 *)"a CoAP request is neither Confirmable nor NON-Confirmable",
                 (string_view)ZEXT816(0x39),args);
      local_50._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_128);
      Error::operator=(__return_storage_ptr__,(Error *)local_50);
      std::__cxx11::string::~string((string *)(local_50 + 8));
      this_00 = &local_128;
      goto LAB_0019fbb6;
    }
    local_d8.mHeader.mCode = aCode;
    local_d8.mHeader._0_1_ = 9;
    local_d8.mHeader.mMessageId = (aRequest->mHeader).mMessageId;
  }
  local_d8.mHeader._0_1_ = local_d8.mHeader._0_1_;
  local_d8.mHeader.mCode = local_d8.mHeader.mCode;
  SendResponse((Error *)local_108,this,aRequest,&local_d8);
  Error::operator=(__return_storage_ptr__,(Error *)local_108);
  this_00 = (string *)(local_108 + 8);
LAB_0019fbb6:
  std::__cxx11::string::~string((string *)this_00);
  Message::~Message(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Error Coap::SendHeaderResponse(Code aCode, const Request &aRequest)
{
    Error    error;
    Response response;

    switch (aRequest.GetType())
    {
    case Type::kConfirmable:
        response.SetType(Type::kAcknowledgment);
        response.SetCode(aCode);
        response.SetMessageId(aRequest.GetMessageId());
        break;

    case Type::kNonConfirmable:
        response.SetType(Type::kNonConfirmable);
        response.SetCode(aCode);
        response.SetMessageId(AllocMessageId());
        break;

    default:
        ExitNow(error = ERROR_INVALID_ARGS("a CoAP request is neither Confirmable nor NON-Confirmable"));
        break;
    }

    SuccessOrExit(error = SendResponse(aRequest, response));

exit:
    return error;
}